

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kkt.c
# Opt level: O3

csc * form_KKT(csc *P,csc *A,c_int format,c_float param1,c_float *param2,c_int *PtoKKT,c_int *AtoKKT
              ,c_int **Pdiag_idx,c_int *Pdiag_n,c_int *param2toKKT)

{
  double dVar1;
  long *plVar2;
  c_float *pcVar3;
  c_int *pcVar4;
  c_int *pcVar5;
  c_float *pcVar6;
  long lVar7;
  csc *T;
  c_int *pcVar8;
  csc *pcVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  c_int cVar15;
  long lVar16;
  
  lVar14 = A->m + P->m;
  T = csc_spalloc(lVar14,lVar14,P->p[P->n] + lVar14 + A->p[A->n],1,1);
  if (T == (csc *)0x0) {
LAB_0010bac5:
    pcVar9 = (csc *)0x0;
  }
  else {
    if (Pdiag_idx != (c_int **)0x0) {
      pcVar8 = (c_int *)malloc(P->m << 3);
      *Pdiag_idx = pcVar8;
      *Pdiag_n = 0;
    }
    if (P->n < 1) {
      lVar14 = 0;
    }
    else {
      plVar2 = P->p;
      lVar12 = *plVar2;
      lVar14 = 0;
      lVar11 = 0;
      do {
        lVar10 = lVar11 + 1;
        lVar16 = plVar2[lVar11 + 1];
        if (lVar12 == lVar16) {
          T->i[lVar14] = lVar11;
          T->p[lVar14] = lVar11;
          T->x[lVar14] = param1;
          lVar14 = lVar14 + 1;
          lVar12 = plVar2[lVar11];
          lVar16 = plVar2[lVar10];
        }
        if (lVar12 < lVar16) {
          pcVar8 = P->i;
          pcVar3 = P->x;
          pcVar4 = T->p;
          pcVar5 = T->i;
          pcVar6 = T->x;
          lVar13 = lVar14;
          do {
            lVar7 = pcVar8[lVar12];
            pcVar5[lVar13] = lVar7;
            pcVar4[lVar13] = lVar11;
            dVar1 = pcVar3[lVar12];
            pcVar6[lVar13] = dVar1;
            if (PtoKKT != (c_int *)0x0) {
              PtoKKT[lVar12] = lVar13;
            }
            if ((lVar7 == lVar11) && (pcVar6[lVar13] = dVar1 + param1, Pdiag_idx != (c_int **)0x0))
            {
              (*Pdiag_idx)[*Pdiag_n] = lVar12;
              *Pdiag_n = *Pdiag_n + 1;
            }
            lVar14 = lVar13 + 1;
            lVar12 = lVar12 + 1;
            lVar16 = plVar2[lVar10];
            if ((lVar7 < lVar11) && (lVar12 == lVar16)) {
              pcVar5[lVar13 + 1] = lVar11;
              pcVar4[lVar13 + 1] = lVar11;
              pcVar6[lVar13 + 1] = param1;
              lVar14 = lVar13 + 2;
              lVar16 = plVar2[lVar10];
            }
            lVar13 = lVar14;
          } while (lVar12 < lVar16);
        }
        lVar12 = lVar16;
        lVar11 = lVar10;
      } while (lVar10 < P->n);
    }
    if (Pdiag_idx != (c_int **)0x0) {
      pcVar8 = (c_int *)realloc(*Pdiag_idx,*Pdiag_n << 3);
      *Pdiag_idx = pcVar8;
    }
    cVar15 = A->n;
    if (0 < cVar15) {
      plVar2 = A->p;
      lVar12 = *plVar2;
      lVar11 = 0;
      do {
        lVar10 = lVar11 + 1;
        lVar16 = plVar2[lVar11 + 1];
        if (lVar12 < plVar2[lVar11 + 1]) {
          pcVar8 = T->p;
          pcVar4 = T->i;
          pcVar3 = T->x;
          pcVar6 = A->x;
          pcVar5 = A->i;
          lVar16 = 0;
          do {
            pcVar8[lVar14 + lVar16] = pcVar5[lVar12 + lVar16] + P->m;
            pcVar4[lVar14 + lVar16] = lVar11;
            pcVar3[lVar14 + lVar16] = pcVar6[lVar12 + lVar16];
            if (AtoKKT != (c_int *)0x0) {
              AtoKKT[lVar12 + lVar16] = lVar16 + lVar14;
            }
            lVar13 = lVar12 + lVar16;
            lVar16 = lVar16 + 1;
          } while (lVar13 + 1 < plVar2[lVar10]);
          cVar15 = A->n;
          lVar14 = lVar14 + lVar16;
          lVar16 = plVar2[lVar10];
        }
        lVar12 = lVar16;
        lVar11 = lVar10;
      } while (lVar10 < cVar15);
    }
    if (0 < A->m) {
      pcVar8 = T->i;
      pcVar4 = T->p;
      pcVar3 = T->x;
      lVar12 = 0;
      do {
        pcVar8[lVar14 + lVar12] = P->n + lVar12;
        pcVar4[lVar14 + lVar12] = P->n + lVar12;
        pcVar3[lVar14 + lVar12] = -param2[lVar12];
        if (param2toKKT != (c_int *)0x0) {
          param2toKKT[lVar12] = lVar12 + lVar14;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < A->m);
      lVar14 = lVar14 + lVar12;
    }
    T->nz = lVar14;
    if ((PtoKKT == (c_int *)0x0 && AtoKKT == (c_int *)0x0) && param2toKKT == (c_int *)0x0) {
      if (format == 0) {
        pcVar9 = triplet_to_csc(T,(c_int *)0x0);
      }
      else {
        pcVar9 = triplet_to_csr(T,(c_int *)0x0);
      }
    }
    else {
      pcVar8 = (c_int *)malloc(lVar14 << 3);
      if (pcVar8 == (c_int *)0x0) {
        csc_spfree(T);
        free(*Pdiag_idx);
        goto LAB_0010bac5;
      }
      if (format == 0) {
        pcVar9 = triplet_to_csc(T,pcVar8);
      }
      else {
        pcVar9 = triplet_to_csr(T,pcVar8);
      }
      if ((PtoKKT != (c_int *)0x0) && (pcVar4 = P->p, 0 < pcVar4[P->n])) {
        lVar14 = 0;
        do {
          PtoKKT[lVar14] = pcVar8[PtoKKT[lVar14]];
          lVar14 = lVar14 + 1;
        } while (lVar14 < pcVar4[P->n]);
      }
      if ((AtoKKT != (c_int *)0x0) && (pcVar4 = A->p, 0 < pcVar4[A->n])) {
        lVar14 = 0;
        do {
          AtoKKT[lVar14] = pcVar8[AtoKKT[lVar14]];
          lVar14 = lVar14 + 1;
        } while (lVar14 < pcVar4[A->n]);
      }
      if ((param2toKKT != (c_int *)0x0) && (0 < A->m)) {
        lVar14 = 0;
        do {
          param2toKKT[lVar14] = pcVar8[param2toKKT[lVar14]];
          lVar14 = lVar14 + 1;
        } while (lVar14 < A->m);
      }
      free(pcVar8);
    }
    csc_spfree(T);
  }
  return pcVar9;
}

Assistant:

csc* form_KKT(const csc  *P,
              const  csc *A,
              c_int       format,
              c_float     param1,
              c_float    *param2,
              c_int      *PtoKKT,
              c_int      *AtoKKT,
              c_int     **Pdiag_idx,
              c_int      *Pdiag_n,
              c_int      *param2toKKT) {
  c_int  nKKT, nnzKKTmax; // Size, number of nonzeros and max number of nonzeros
                          // in KKT matrix
  csc   *KKT_trip, *KKT;  // KKT matrix in triplet format and CSC format
  c_int  ptr, i, j;       // Counters for elements (i,j) and index pointer
  c_int  zKKT = 0;        // Counter for total number of elements in P and in
                          // KKT
  c_int *KKT_TtoC;        // Pointer to vector mapping from KKT in triplet form
                          // to CSC

  // Get matrix dimensions
  nKKT = P->m + A->m;

  // Get maximum number of nonzero elements (only upper triangular part)
  nnzKKTmax = P->p[P->n] + // Number of elements in P
              P->m +       // Number of elements in param1 * I
              A->p[A->n] + // Number of nonzeros in A
              A->m;        // Number of elements in - diag(param2)

  // Preallocate KKT matrix in triplet format
  KKT_trip = csc_spalloc(nKKT, nKKT, nnzKKTmax, 1, 1);

  if (!KKT_trip) return OSQP_NULL;  // Failed to preallocate matrix

  // Allocate vector of indices on the diagonal. Worst case it has m elements
  if (Pdiag_idx != OSQP_NULL) {
    (*Pdiag_idx) = c_malloc(P->m * sizeof(c_int));
    *Pdiag_n     = 0; // Set 0 diagonal elements to start
  }

  // Allocate Triplet matrices
  // P + param1 I
  for (j = 0; j < P->n; j++) { // cycle over columns
    // No elements in column j => add diagonal element param1
    if (P->p[j] == P->p[j + 1]) {
      KKT_trip->i[zKKT] = j;
      KKT_trip->p[zKKT] = j;
      KKT_trip->x[zKKT] = param1;
      zKKT++;
    }

    for (ptr = P->p[j]; ptr < P->p[j + 1]; ptr++) { // cycle over rows
      // Get current row
      i = P->i[ptr];

      // Add element of P
      KKT_trip->i[zKKT] = i;
      KKT_trip->p[zKKT] = j;
      KKT_trip->x[zKKT] = P->x[ptr];

      if (PtoKKT != OSQP_NULL) PtoKKT[ptr] = zKKT;  // Update index from P to
                                                    // KKTtrip

      if (i == j) {                                 // P has a diagonal element,
                                                    // add param1
        KKT_trip->x[zKKT] += param1;

        // If index vector pointer supplied -> Store the index
        if (Pdiag_idx != OSQP_NULL) {
          (*Pdiag_idx)[*Pdiag_n] = ptr;
          (*Pdiag_n)++;
        }
      }
      zKKT++;

      // Add diagonal param1 in case
      if ((i < j) &&                  // Diagonal element not reached
          (ptr + 1 == P->p[j + 1])) { // last element of column j
        // Add diagonal element param1
        KKT_trip->i[zKKT] = j;
        KKT_trip->p[zKKT] = j;
        KKT_trip->x[zKKT] = param1;
        zKKT++;
      }
    }
  }

  if (Pdiag_idx != OSQP_NULL) {
    // Realloc Pdiag_idx so that it contains exactly *Pdiag_n diagonal elements
    (*Pdiag_idx) = c_realloc((*Pdiag_idx), (*Pdiag_n) * sizeof(c_int));
  }


  // A' at top right
  for (j = 0; j < A->n; j++) {                      // Cycle over columns of A
    for (ptr = A->p[j]; ptr < A->p[j + 1]; ptr++) {
      KKT_trip->p[zKKT] = P->m + A->i[ptr];         // Assign column index from
                                                    // row index of A
      KKT_trip->i[zKKT] = j;                        // Assign row index from
                                                    // column index of A
      KKT_trip->x[zKKT] = A->x[ptr];                // Assign A value element

      if (AtoKKT != OSQP_NULL) AtoKKT[ptr] = zKKT;  // Update index from A to
                                                    // KKTtrip
      zKKT++;
    }
  }

  // - diag(param2) at bottom right
  for (j = 0; j < A->m; j++) {
    KKT_trip->i[zKKT] = j + P->n;
    KKT_trip->p[zKKT] = j + P->n;
    KKT_trip->x[zKKT] = -param2[j];

    if (param2toKKT != OSQP_NULL) param2toKKT[j] = zKKT;  // Update index from
                                                          // param2 to KKTtrip
    zKKT++;
  }

  // Allocate number of nonzeros
  KKT_trip->nz = zKKT;

  // Convert triplet matrix to csc format
  if (!PtoKKT && !AtoKKT && !param2toKKT) {
    // If no index vectors passed, do not store KKT mapping from Trip to CSC/CSR
    if (format == 0) KKT = triplet_to_csc(KKT_trip, OSQP_NULL);
    else KKT = triplet_to_csr(KKT_trip, OSQP_NULL);
  }
  else {
    // Allocate vector of indices from triplet to csc
    KKT_TtoC = c_malloc((zKKT) * sizeof(c_int));

    if (!KKT_TtoC) {
      // Error in allocating KKT_TtoC vector
      csc_spfree(KKT_trip);
      c_free(*Pdiag_idx);
      return OSQP_NULL;
    }

    // Store KKT mapping from Trip to CSC/CSR
    if (format == 0)
      KKT = triplet_to_csc(KKT_trip, KKT_TtoC);
    else
      KKT = triplet_to_csr(KKT_trip, KKT_TtoC);

    // Update vectors of indices from P, A, param2 to KKT (now in CSC format)
    if (PtoKKT != OSQP_NULL) {
      for (i = 0; i < P->p[P->n]; i++) {
        PtoKKT[i] = KKT_TtoC[PtoKKT[i]];
      }
    }

    if (AtoKKT != OSQP_NULL) {
      for (i = 0; i < A->p[A->n]; i++) {
        AtoKKT[i] = KKT_TtoC[AtoKKT[i]];
      }
    }

    if (param2toKKT != OSQP_NULL) {
      for (i = 0; i < A->m; i++) {
        param2toKKT[i] = KKT_TtoC[param2toKKT[i]];
      }
    }

    // Free mapping
    c_free(KKT_TtoC);
  }

  // Clean matrix in triplet format and return result
  csc_spfree(KKT_trip);

  return KKT;
}